

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_avx2.cpp
# Opt level: O3

int __thiscall
ncnn::LRN_x86_avx2::forward_inplace(LRN_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  size_t _elemsize;
  bool bVar1;
  undefined1 auVar2 [32];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int *piVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  Mat *pMVar14;
  pointer piVar15;
  uint uVar16;
  _func_int **pp_Var17;
  int iVar18;
  ulong uVar19;
  _func_int ***ppp_Var20;
  _func_int *p_Var21;
  ulong uVar22;
  int iVar23;
  float *pfVar24;
  _func_int ***ppp_Var25;
  void *pvVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  long lVar31;
  uint uVar32;
  int iVar33;
  uint uVar34;
  undefined1 (*pauVar35) [32];
  long lVar36;
  float fVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  allocator_type local_231;
  ulong local_230;
  Mat local_228;
  Mat *local_1e0;
  undefined8 local_1d8;
  ulong local_1d0;
  Mat local_1c8;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int iStack_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  float local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined1 local_148 [16];
  long local_138;
  Allocator *local_130;
  long local_128;
  void *local_120;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  uint local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  auVar43 = local_118;
  local_178 = bottom_top_blob->w;
  local_118._4_4_ = 0;
  local_118._0_4_ = bottom_top_blob->h;
  uVar32 = bottom_top_blob->c;
  uVar22 = (ulong)uVar32;
  _elemsize = bottom_top_blob->elemsize;
  local_1c8.cstep = 0;
  local_1c8.data = (Allocator *)0x0;
  local_1c8.refcount._0_4_ = 0;
  local_1c8.refcount._4_4_ = 0;
  local_1c8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_1c8.elempack = 0;
  iStack_174 = 0;
  local_118._8_24_ = auVar43._8_24_;
  local_1c8.allocator = (Allocator *)local_1c8.data;
  local_1c8.dims = (int)local_1c8.refcount;
  local_1c8.w = local_1c8.refcount._4_4_;
  local_1c8._48_8_ = local_1c8.elemsize;
  local_1c8.c = local_1c8.elempack;
  Mat::create(&local_1c8,local_178,bottom_top_blob->h,uVar32,_elemsize,opt->workspace_allocator);
  iVar28 = -100;
  if (((Allocator *)local_1c8.data == (Allocator *)0x0) ||
     ((long)local_1c8.c * local_1c8.cstep == 0)) goto LAB_001ef63b;
  uVar34 = local_118._0_4_ * local_178;
  if (0 < (int)uVar32) {
    uVar19 = 0;
    do {
      pfVar24 = (float *)(bottom_top_blob->cstep * uVar19 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      ppp_Var20 = (_func_int ***)
                  ((long)(_func_int ***)local_1c8.data +
                  local_1c8.cstep * uVar19 * local_1c8.elemsize);
      if ((int)uVar34 < 8) {
        uVar16 = 0;
      }
      else {
        iVar28 = 7;
        do {
          auVar43._4_4_ = pfVar24[1] * pfVar24[1];
          auVar43._0_4_ = *pfVar24 * *pfVar24;
          auVar43._8_4_ = pfVar24[2] * pfVar24[2];
          auVar43._12_4_ = pfVar24[3] * pfVar24[3];
          auVar43._16_4_ = pfVar24[4] * pfVar24[4];
          auVar43._20_4_ = pfVar24[5] * pfVar24[5];
          auVar43._24_4_ = pfVar24[6] * pfVar24[6];
          auVar43._28_4_ = pfVar24[7];
          *(undefined1 (*) [32])ppp_Var20 = auVar43;
          pfVar24 = pfVar24 + 8;
          ppp_Var20 = ppp_Var20 + 4;
          iVar28 = iVar28 + 8;
          uVar16 = uVar34 & 0xfffffff8;
        } while (iVar28 < (int)uVar34);
      }
      if (uVar34 - uVar16 != 0 && (int)uVar16 <= (int)uVar34) {
        lVar31 = 0;
        do {
          *(float *)((long)ppp_Var20 + lVar31 * 4) = pfVar24[lVar31] * pfVar24[lVar31];
          lVar31 = lVar31 + 1;
        } while (uVar34 - uVar16 != (int)lVar31);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar22);
  }
  pp_Var17 = this->_vptr_LRN_x86_avx2;
  local_1d0 = uVar22;
  if (*(int *)(&this->field_0xd0 + (long)pp_Var17[-3]) == 0) {
    local_228.cstep = 0;
    local_228.data = (Allocator *)0x0;
    local_228.refcount._0_4_ = 0;
    local_228.refcount._4_4_ = 0;
    local_228.elemsize._0_4_ = 0;
    local_228.elemsize._4_4_ = 0;
    local_228.elempack = 0;
    local_228.allocator = (Allocator *)0x0;
    local_228.dims = 0;
    local_228.w = 0;
    local_228.h = 0;
    local_228.d = 0;
    local_228.c = 0;
    Mat::create(&local_228,local_178,local_118._0_4_,uVar32,_elemsize,opt->workspace_allocator);
    if (((Allocator *)local_228.data == (Allocator *)0x0) ||
       (local_228.cstep * (long)local_228.c == 0)) {
      piVar10 = (int *)CONCAT44(local_228.refcount._4_4_,(int)local_228.refcount);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_228.allocator == (Allocator *)0x0) {
joined_r0x001ef613:
            if ((Allocator *)local_228.data != (Allocator *)0x0) {
              free(local_228.data);
            }
          }
          else {
            (*(local_228.allocator)->_vptr_Allocator[3])();
          }
        }
      }
LAB_001ef636:
      iVar28 = -100;
      goto LAB_001ef63b;
    }
    uVar16 = (int)local_228.cstep * local_228.c;
    if (0 < (int)uVar16) {
      memset(local_228.data,0,(ulong)uVar16 << 2);
    }
    if (0 < (int)uVar32) {
      pp_Var17 = this->_vptr_LRN_x86_avx2;
      fVar37 = *(float *)(&this->field_0xd8 + (long)pp_Var17[-3]) /
               (float)*(int *)(&this->field_0xd4 + (long)pp_Var17[-3]);
      local_148 = ZEXT416((uint)fVar37);
      auVar53 = ZEXT1664(local_148);
      local_118._4_4_ = fVar37;
      local_118._0_4_ = fVar37;
      local_118._8_4_ = fVar37;
      local_118._12_4_ = fVar37;
      local_118._16_4_ = fVar37;
      local_118._20_4_ = fVar37;
      local_118._24_4_ = fVar37;
      local_118._28_4_ = fVar37;
      uVar19 = 0;
      fVar37 = -0.0;
      local_d8._8_4_ = 0x807fffff;
      local_d8._0_8_ = 0x807fffff807fffff;
      local_d8._12_4_ = 0x807fffff;
      local_d8._16_4_ = 0x807fffff;
      local_d8._20_4_ = 0x807fffff;
      local_d8._24_4_ = 0x807fffff;
      local_d8._28_4_ = 0x807fffff;
      local_f8._8_4_ = 0x3f000000;
      local_f8._0_8_ = 0x3f0000003f000000;
      local_f8._12_4_ = 0x3f000000;
      local_f8._16_4_ = 0x3f000000;
      local_f8._20_4_ = 0x3f000000;
      local_f8._24_4_ = 0x3f000000;
      local_f8._28_4_ = 0x3f000000;
      local_1d8 = CONCAT44(local_1d8._4_4_,uVar34) & 0xfffffffffffffff8;
      local_b8 = 0xffffff82;
      uStack_b4 = 0xffffff82;
      uStack_b0 = 0xffffff82;
      uStack_ac = 0xffffff82;
      uStack_a8 = 0xffffff82;
      uStack_a4 = 0xffffff82;
      uStack_a0 = 0xffffff82;
      uStack_9c = 0xffffff82;
      local_158 = -0.0;
      uStack_154 = 0x80000000;
      uStack_150 = 0x80000000;
      uStack_14c = 0x80000000;
      uVar32 = uVar34 & 0xfffffff8;
      local_1e0 = bottom_top_blob;
      do {
        auVar55._8_4_ = 0x800000;
        auVar55._0_8_ = 0x80000000800000;
        auVar55._12_4_ = 0x800000;
        auVar55._16_4_ = 0x800000;
        auVar55._20_4_ = 0x800000;
        auVar55._24_4_ = 0x800000;
        auVar55._28_4_ = 0x800000;
        p_Var21 = pp_Var17[-3];
        iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var21) / 2;
        iVar33 = (int)uVar19;
        uVar16 = iVar33 - iVar28;
        if ((int)uVar16 <= iVar28 + iVar33) {
          do {
            if (uVar16 < (uint)uVar22) {
              ppp_Var20 = (_func_int ***)
                          ((long)(_func_int ***)local_1c8.data +
                          uVar16 * local_1c8.cstep * local_1c8.elemsize);
              ppp_Var25 = (_func_int ***)
                          ((long)(_func_int ***)local_228.data +
                          local_228.cstep * uVar19 *
                          CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize));
              uVar29 = 0;
              if (7 < (int)uVar34) {
                iVar28 = 7;
                do {
                  auVar38._0_4_ = *(float *)ppp_Var25 + *(float *)ppp_Var20;
                  auVar38._4_4_ = *(float *)((long)ppp_Var25 + 4) + *(float *)((long)ppp_Var20 + 4);
                  auVar38._8_4_ = *(float *)(ppp_Var25 + 1) + *(float *)(ppp_Var20 + 1);
                  auVar38._12_4_ =
                       *(float *)((long)(ppp_Var25 + 1) + 4) + *(float *)((long)(ppp_Var20 + 1) + 4)
                  ;
                  auVar38._16_4_ = *(float *)(ppp_Var25 + 2) + *(float *)(ppp_Var20 + 2);
                  auVar38._20_4_ =
                       *(float *)((long)(ppp_Var25 + 2) + 4) + *(float *)((long)(ppp_Var20 + 2) + 4)
                  ;
                  auVar38._24_4_ = *(float *)(ppp_Var25 + 3) + *(float *)(ppp_Var20 + 3);
                  auVar38._28_4_ =
                       *(float *)((long)(ppp_Var25 + 3) + 4) + *(float *)((long)(ppp_Var20 + 3) + 4)
                  ;
                  *(undefined1 (*) [32])ppp_Var25 = auVar38;
                  ppp_Var20 = ppp_Var20 + 4;
                  ppp_Var25 = ppp_Var25 + 4;
                  iVar28 = iVar28 + 8;
                  uVar29 = uVar32;
                } while (iVar28 < (int)uVar34);
              }
              if (uVar34 - uVar29 != 0 && (int)uVar29 <= (int)uVar34) {
                lVar31 = 0;
                do {
                  *(float *)((long)ppp_Var25 + lVar31 * 4) =
                       *(float *)((long)ppp_Var25 + lVar31 * 4) +
                       *(float *)((long)ppp_Var20 + lVar31 * 4);
                  lVar31 = lVar31 + 1;
                } while (uVar34 - uVar29 != (int)lVar31);
              }
            }
            p_Var21 = pp_Var17[-3];
            bVar1 = (int)uVar16 < *(int *)(&this->field_0xd4 + (long)p_Var21) / 2 + iVar33;
            uVar16 = uVar16 + 1;
          } while (bVar1);
        }
        pauVar35 = (undefined1 (*) [32])
                   (local_1e0->cstep * uVar19 * local_1e0->elemsize + (long)local_1e0->data);
        ppp_Var20 = (_func_int ***)
                    ((long)(_func_int ***)local_228.data +
                    local_228.cstep * uVar19 *
                    CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize));
        uVar16 = 0;
        if (7 < (int)uVar34) {
          local_178 = *(int *)(&this->field_0xe0 + (long)p_Var21);
          local_98 = (float)((uint)fVar37 ^ *(uint *)(&this->field_0xdc + (long)p_Var21));
          iVar28 = 7;
          auVar54._8_4_ = 0x3f800000;
          auVar54._0_8_ = 0x3f8000003f800000;
          auVar54._12_4_ = 0x3f800000;
          auVar54._16_4_ = 0x3f800000;
          auVar54._20_4_ = 0x3f800000;
          auVar54._24_4_ = 0x3f800000;
          auVar54._28_4_ = 0x3f800000;
          auVar67._8_4_ = 0x3e11e9bf;
          auVar67._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar67._12_4_ = 0x3e11e9bf;
          auVar67._16_4_ = 0x3e11e9bf;
          auVar67._20_4_ = 0x3e11e9bf;
          auVar67._24_4_ = 0x3e11e9bf;
          auVar67._28_4_ = 0x3e11e9bf;
          auVar39._8_4_ = 0x3f317218;
          auVar39._0_8_ = 0x3f3172183f317218;
          auVar39._12_4_ = 0x3f317218;
          auVar39._16_4_ = 0x3f317218;
          auVar39._20_4_ = 0x3f317218;
          auVar39._24_4_ = 0x3f317218;
          auVar39._28_4_ = 0x3f317218;
          auVar40._8_4_ = 0xbf000000;
          auVar40._0_8_ = 0xbf000000bf000000;
          auVar40._12_4_ = 0xbf000000;
          auVar40._16_4_ = 0xbf000000;
          auVar40._20_4_ = 0xbf000000;
          auVar40._24_4_ = 0xbf000000;
          auVar40._28_4_ = 0xbf000000;
          do {
            auVar11._4_4_ = local_178;
            auVar11._0_4_ = local_178;
            auVar11._8_4_ = local_178;
            auVar11._12_4_ = local_178;
            auVar11._16_4_ = local_178;
            auVar11._20_4_ = local_178;
            auVar11._24_4_ = local_178;
            auVar11._28_4_ = local_178;
            auVar9 = vfmadd213ps_fma(*(undefined1 (*) [32])ppp_Var20,local_118,auVar11);
            auVar2 = vmaxps_avx(auVar55,ZEXT1632(auVar9));
            auVar43 = vandps_avx(auVar2,local_d8);
            auVar7 = vorps_avx(local_f8,auVar43);
            auVar51._8_4_ = 0x3f3504f3;
            auVar51._0_8_ = 0x3f3504f33f3504f3;
            auVar51._12_4_ = 0x3f3504f3;
            auVar51._16_4_ = 0x3f3504f3;
            auVar51._20_4_ = 0x3f3504f3;
            auVar51._24_4_ = 0x3f3504f3;
            auVar51._28_4_ = 0x3f3504f3;
            auVar38 = vcmpps_avx(auVar7,auVar51,1);
            auVar43 = vandps_avx(auVar38,auVar7);
            auVar48._0_4_ = auVar7._0_4_ + -1.0 + auVar43._0_4_;
            auVar48._4_4_ = auVar7._4_4_ + -1.0 + auVar43._4_4_;
            auVar48._8_4_ = auVar7._8_4_ + -1.0 + auVar43._8_4_;
            auVar48._12_4_ = auVar7._12_4_ + -1.0 + auVar43._12_4_;
            auVar48._16_4_ = auVar7._16_4_ + -1.0 + auVar43._16_4_;
            auVar48._20_4_ = auVar7._20_4_ + -1.0 + auVar43._20_4_;
            auVar48._24_4_ = auVar7._24_4_ + -1.0 + auVar43._24_4_;
            auVar48._28_4_ = auVar7._28_4_ + -1.0 + auVar43._28_4_;
            auVar43 = vpsrld_avx2(auVar2,0x17);
            auVar12._4_4_ = uStack_b4;
            auVar12._0_4_ = local_b8;
            auVar12._8_4_ = uStack_b0;
            auVar12._12_4_ = uStack_ac;
            auVar12._16_4_ = uStack_a8;
            auVar12._20_4_ = uStack_a4;
            auVar12._24_4_ = uStack_a0;
            auVar12._28_4_ = uStack_9c;
            auVar43 = vpaddd_avx2(auVar43,auVar12);
            auVar2 = vcvtdq2ps_avx(auVar43);
            auVar43 = vandps_avx(auVar54,auVar38);
            auVar38 = vsubps_avx(auVar2,auVar43);
            auVar52._8_4_ = 0x3d9021bb;
            auVar52._0_8_ = 0x3d9021bb3d9021bb;
            auVar52._12_4_ = 0x3d9021bb;
            auVar52._16_4_ = 0x3d9021bb;
            auVar52._20_4_ = 0x3d9021bb;
            auVar52._24_4_ = 0x3d9021bb;
            auVar52._28_4_ = 0x3d9021bb;
            auVar63._8_4_ = 0xbdebd1b8;
            auVar63._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar63._12_4_ = 0xbdebd1b8;
            auVar63._16_4_ = 0xbdebd1b8;
            auVar63._20_4_ = 0xbdebd1b8;
            auVar63._24_4_ = 0xbdebd1b8;
            auVar63._28_4_ = 0xbdebd1b8;
            auVar8 = vfmadd213ps_fma(auVar52,auVar48,auVar63);
            auVar64._8_4_ = 0x3def251a;
            auVar64._0_8_ = 0x3def251a3def251a;
            auVar64._12_4_ = 0x3def251a;
            auVar64._16_4_ = 0x3def251a;
            auVar64._20_4_ = 0x3def251a;
            auVar64._24_4_ = 0x3def251a;
            auVar64._28_4_ = 0x3def251a;
            auVar8 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar48,auVar64);
            auVar65._8_4_ = 0xbdfe5d4f;
            auVar65._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar65._12_4_ = 0xbdfe5d4f;
            auVar65._16_4_ = 0xbdfe5d4f;
            auVar65._20_4_ = 0xbdfe5d4f;
            auVar65._24_4_ = 0xbdfe5d4f;
            auVar65._28_4_ = 0xbdfe5d4f;
            auVar8 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar48,auVar65);
            auVar8 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar48,auVar67);
            auVar66._8_4_ = 0xbe2aae50;
            auVar66._0_8_ = 0xbe2aae50be2aae50;
            auVar66._12_4_ = 0xbe2aae50;
            auVar66._16_4_ = 0xbe2aae50;
            auVar66._20_4_ = 0xbe2aae50;
            auVar66._24_4_ = 0xbe2aae50;
            auVar66._28_4_ = 0xbe2aae50;
            auVar8 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar48,auVar66);
            auVar43 = vcmpps_avx(ZEXT1632(auVar9),ZEXT832(0) << 0x20,2);
            auVar56._8_4_ = 0x3e4cceac;
            auVar56._0_8_ = 0x3e4cceac3e4cceac;
            auVar56._12_4_ = 0x3e4cceac;
            auVar56._16_4_ = 0x3e4cceac;
            auVar56._20_4_ = 0x3e4cceac;
            auVar56._24_4_ = 0x3e4cceac;
            auVar56._28_4_ = 0x3e4cceac;
            auVar9 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar48,auVar56);
            auVar57._8_4_ = 0xbe7ffffc;
            auVar57._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar57._12_4_ = 0xbe7ffffc;
            auVar57._16_4_ = 0xbe7ffffc;
            auVar57._20_4_ = 0xbe7ffffc;
            auVar57._24_4_ = 0xbe7ffffc;
            auVar57._28_4_ = 0xbe7ffffc;
            auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar48,auVar57);
            auVar58._8_4_ = 0x3eaaaaaa;
            auVar58._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar58._12_4_ = 0x3eaaaaaa;
            auVar58._16_4_ = 0x3eaaaaaa;
            auVar58._20_4_ = 0x3eaaaaaa;
            auVar58._24_4_ = 0x3eaaaaaa;
            auVar58._28_4_ = 0x3eaaaaaa;
            auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar48,auVar58);
            auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar48,auVar40);
            auVar8 = vfmadd213ps_fma(auVar38,auVar39,auVar48);
            auVar2._4_4_ = auVar48._4_4_ * auVar48._4_4_;
            auVar2._0_4_ = auVar48._0_4_ * auVar48._0_4_;
            auVar2._8_4_ = auVar48._8_4_ * auVar48._8_4_;
            auVar2._12_4_ = auVar48._12_4_ * auVar48._12_4_;
            auVar2._16_4_ = auVar48._16_4_ * auVar48._16_4_;
            auVar2._20_4_ = auVar48._20_4_ * auVar48._20_4_;
            auVar2._24_4_ = auVar48._24_4_ * auVar48._24_4_;
            auVar2._28_4_ = auVar48._28_4_;
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar2,ZEXT1632(auVar9));
            auVar43 = vorps_avx(auVar43,ZEXT1632(auVar9));
            auVar7._4_4_ = auVar43._4_4_ * local_98;
            auVar7._0_4_ = auVar43._0_4_ * local_98;
            auVar7._8_4_ = auVar43._8_4_ * local_98;
            auVar7._12_4_ = auVar43._12_4_ * local_98;
            auVar7._16_4_ = auVar43._16_4_ * local_98;
            auVar7._20_4_ = auVar43._20_4_ * local_98;
            auVar7._24_4_ = auVar43._24_4_ * local_98;
            auVar7._28_4_ = auVar43._28_4_;
            auVar44._8_4_ = 0x42b0c0a5;
            auVar44._0_8_ = 0x42b0c0a542b0c0a5;
            auVar44._12_4_ = 0x42b0c0a5;
            auVar44._16_4_ = 0x42b0c0a5;
            auVar44._20_4_ = 0x42b0c0a5;
            auVar44._24_4_ = 0x42b0c0a5;
            auVar44._28_4_ = 0x42b0c0a5;
            auVar43 = vminps_avx(auVar7,auVar44);
            auVar45._8_4_ = 0xc2b0c0a5;
            auVar45._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar45._12_4_ = 0xc2b0c0a5;
            auVar45._16_4_ = 0xc2b0c0a5;
            auVar45._20_4_ = 0xc2b0c0a5;
            auVar45._24_4_ = 0xc2b0c0a5;
            auVar45._28_4_ = 0xc2b0c0a5;
            auVar38 = vmaxps_avx(auVar43,auVar45);
            auVar46._8_4_ = 0x3fb8aa3b;
            auVar46._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar46._12_4_ = 0x3fb8aa3b;
            auVar46._16_4_ = 0x3fb8aa3b;
            auVar46._20_4_ = 0x3fb8aa3b;
            auVar46._24_4_ = 0x3fb8aa3b;
            auVar46._28_4_ = 0x3fb8aa3b;
            auVar9 = vfmsub213ps_fma(auVar46,auVar38,auVar40);
            auVar2 = vroundps_avx(ZEXT1632(auVar9),1);
            auVar43 = vcmpps_avx(ZEXT1632(auVar9),auVar2,1);
            auVar43 = vandps_avx(auVar54,auVar43);
            auVar43 = vsubps_avx(auVar2,auVar43);
            auVar8 = vfnmadd231ps_fma(auVar38,auVar43,auVar39);
            auVar49._8_4_ = 0x39506967;
            auVar49._0_8_ = 0x3950696739506967;
            auVar49._12_4_ = 0x39506967;
            auVar49._16_4_ = 0x39506967;
            auVar49._20_4_ = 0x39506967;
            auVar49._24_4_ = 0x39506967;
            auVar49._28_4_ = 0x39506967;
            auVar38 = ZEXT1632(auVar8);
            fVar3 = auVar8._0_4_;
            fVar4 = auVar8._4_4_;
            fVar5 = auVar8._8_4_;
            fVar6 = auVar8._12_4_;
            auVar59._8_4_ = 0x3ab743ce;
            auVar59._0_8_ = 0x3ab743ce3ab743ce;
            auVar59._12_4_ = 0x3ab743ce;
            auVar59._16_4_ = 0x3ab743ce;
            auVar59._20_4_ = 0x3ab743ce;
            auVar59._24_4_ = 0x3ab743ce;
            auVar59._28_4_ = 0x3ab743ce;
            auVar9 = vfmadd213ps_fma(auVar49,auVar38,auVar59);
            auVar60._8_4_ = 0x3c088908;
            auVar60._0_8_ = 0x3c0889083c088908;
            auVar60._12_4_ = 0x3c088908;
            auVar60._16_4_ = 0x3c088908;
            auVar60._20_4_ = 0x3c088908;
            auVar60._24_4_ = 0x3c088908;
            auVar60._28_4_ = 0x3c088908;
            auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar38,auVar60);
            auVar61._8_4_ = 0x3d2aa9c1;
            auVar61._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar61._12_4_ = 0x3d2aa9c1;
            auVar61._16_4_ = 0x3d2aa9c1;
            auVar61._20_4_ = 0x3d2aa9c1;
            auVar61._24_4_ = 0x3d2aa9c1;
            auVar61._28_4_ = 0x3d2aa9c1;
            auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar38,auVar61);
            auVar62._8_4_ = 0x3e2aaaaa;
            auVar62._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar62._12_4_ = 0x3e2aaaaa;
            auVar62._16_4_ = 0x3e2aaaaa;
            auVar62._20_4_ = 0x3e2aaaaa;
            auVar62._24_4_ = 0x3e2aaaaa;
            auVar62._28_4_ = 0x3e2aaaaa;
            auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar8),auVar62);
            auVar9 = vfmsub213ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar8),auVar40);
            auVar41._0_4_ = fVar3 + 1.0;
            auVar41._4_4_ = fVar4 + 1.0;
            auVar41._8_4_ = fVar5 + 1.0;
            auVar41._12_4_ = fVar6 + 1.0;
            auVar41._16_4_ = 0x3f800000;
            auVar41._20_4_ = 0x3f800000;
            auVar41._24_4_ = 0x3f800000;
            auVar41._28_4_ = 0x3f800000;
            auVar9 = vfmadd231ps_fma(auVar41,ZEXT1632(CONCAT412(fVar6 * fVar6,
                                                                CONCAT48(fVar5 * fVar5,
                                                                         CONCAT44(fVar4 * fVar4,
                                                                                  fVar3 * fVar3)))),
                                     ZEXT1632(auVar9));
            auVar47._0_4_ = (int)auVar43._0_4_;
            auVar47._4_4_ = (int)auVar43._4_4_;
            auVar47._8_4_ = (int)auVar43._8_4_;
            auVar47._12_4_ = (int)auVar43._12_4_;
            auVar47._16_4_ = (int)auVar43._16_4_;
            auVar47._20_4_ = (int)auVar43._20_4_;
            auVar47._24_4_ = (int)auVar43._24_4_;
            auVar47._28_4_ = (int)auVar43._28_4_;
            auVar43 = vpslld_avx2(auVar47,0x17);
            auVar50._8_4_ = 0x3f800000;
            auVar50._0_8_ = 0x3f8000003f800000;
            auVar50._12_4_ = 0x3f800000;
            auVar50._16_4_ = 0x3f800000;
            auVar50._20_4_ = 0x3f800000;
            auVar50._24_4_ = 0x3f800000;
            auVar50._28_4_ = 0x3f800000;
            auVar43 = vpaddd_avx2(auVar43,auVar50);
            auVar42._0_4_ = auVar43._0_4_ * *(float *)*pauVar35 * auVar9._0_4_;
            auVar42._4_4_ = auVar43._4_4_ * *(float *)((long)*pauVar35 + 4) * auVar9._4_4_;
            auVar42._8_4_ = auVar43._8_4_ * *(float *)((long)*pauVar35 + 8) * auVar9._8_4_;
            auVar42._12_4_ = auVar43._12_4_ * *(float *)((long)*pauVar35 + 0xc) * auVar9._12_4_;
            auVar42._16_4_ = auVar43._16_4_ * *(float *)((long)*pauVar35 + 0x10) * 0.0;
            auVar42._20_4_ = auVar43._20_4_ * *(float *)((long)*pauVar35 + 0x14) * 0.0;
            auVar42._24_4_ = auVar43._24_4_ * *(float *)((long)*pauVar35 + 0x18) * 0.0;
            auVar42._28_4_ = 0;
            *pauVar35 = auVar42;
            ppp_Var20 = ppp_Var20 + 4;
            pauVar35 = pauVar35 + 1;
            iVar28 = iVar28 + 8;
            uVar16 = uVar32;
            iStack_174 = local_178;
            iStack_170 = local_178;
            iStack_16c = local_178;
            iStack_168 = local_178;
            iStack_164 = local_178;
            iStack_160 = local_178;
            iStack_15c = local_178;
            fStack_94 = local_98;
            fStack_90 = local_98;
            fStack_8c = local_98;
            fStack_88 = local_98;
            fStack_84 = local_98;
            fStack_80 = local_98;
            fStack_7c = local_98;
          } while (iVar28 < (int)uVar34);
        }
        local_230 = uVar19;
        if (uVar34 - uVar16 != 0 && (int)uVar16 <= (int)uVar34) {
          lVar31 = 0;
          do {
            auVar9 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)ppp_Var20 + lVar31 * 4)),auVar53._0_16_
                                     ,ZEXT416(*(uint *)(&this->field_0xe0 + (long)pp_Var17[-3])));
            fVar37 = powf(auVar9._0_4_,
                          (float)((uint)fVar37 ^ *(uint *)(&this->field_0xdc + (long)pp_Var17[-3])))
            ;
            auVar53 = ZEXT1664(local_148);
            *(float *)((long)*pauVar35 + lVar31 * 4) =
                 fVar37 * *(float *)((long)*pauVar35 + lVar31 * 4);
            lVar31 = lVar31 + 1;
            fVar37 = local_158;
          } while (uVar34 - uVar16 != (int)lVar31);
        }
        uVar19 = local_230 + 1;
        uVar22 = local_1d0;
        uVar32 = (uint)local_1d8;
      } while (uVar19 != local_1d0);
    }
    piVar10 = (int *)CONCAT44(local_228.refcount._4_4_,(int)local_228.refcount);
    iVar28 = 0;
    if (piVar10 == (int *)0x0) goto LAB_001ef63b;
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 != 0) goto LAB_001ef63b;
    if (local_228.allocator != (Allocator *)0x0) {
      (*(local_228.allocator)->_vptr_Allocator[3])();
      goto LAB_001ef63b;
    }
  }
  else {
    if (*(int *)(&this->field_0xd0 + (long)pp_Var17[-3]) != 1) {
      iVar28 = 0;
      goto LAB_001ef63b;
    }
    piVar10 = (int *)CONCAT44(local_1c8.refcount._4_4_,(int)local_1c8.refcount);
    local_228.data = local_1c8.data;
    local_228.refcount._0_4_ = (int)local_1c8.refcount;
    local_228.refcount._4_4_ = local_1c8.refcount._4_4_;
    local_228.elemsize._0_4_ = (undefined4)local_1c8.elemsize;
    local_228.elemsize._4_4_ = (undefined4)(local_1c8.elemsize >> 0x20);
    local_228.elempack = local_1c8.elempack;
    local_228.allocator = local_1c8.allocator;
    local_228.dims = local_1c8.dims;
    local_228.w = local_1c8.w;
    local_228.h = local_1c8.h;
    local_228.d = local_1c8.d;
    local_228.c = local_1c8.c;
    local_228.cstep = local_1c8.cstep;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + 1;
      UNLOCK();
      pp_Var17 = this->_vptr_LRN_x86_avx2;
    }
    p_Var21 = pp_Var17[-3];
    fVar37 = *(float *)(&this->field_0xd4 + (long)p_Var21);
    iVar28 = local_178;
    if (1 < (int)fVar37) {
      uVar34 = (uint)fVar37 >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      iVar28 = ~uVar34 + *(int *)(&this->field_0xd4 + (long)pp_Var17[-3]);
      copy_make_border(&local_1c8,&local_228,uVar34,iVar28,uVar34,iVar28,0,0.0,(Option *)&_space_ofs
                      );
      if (((Allocator *)local_228.data == (Allocator *)0x0) ||
         ((long)local_228.c * local_228.cstep == 0)) {
        piVar10 = (int *)CONCAT44(local_228.refcount._4_4_,(int)local_228.refcount);
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            if (local_228.allocator == (Allocator *)0x0) goto joined_r0x001ef613;
            (*(local_228.allocator)->_vptr_Allocator[3])();
          }
        }
        goto LAB_001ef636;
      }
      p_Var21 = this->_vptr_LRN_x86_avx2[-3];
      fVar37 = *(float *)(&this->field_0xd4 + (long)p_Var21);
      iVar28 = local_228.w;
    }
    uVar34 = (int)fVar37 * (int)fVar37;
    local_148._0_4_ = *(undefined4 *)(&this->field_0xd8 + (long)p_Var21);
    local_98 = fVar37;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar34,&local_231);
    piVar15 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pp_Var17 = this->_vptr_LRN_x86_avx2;
    iVar33 = *(int *)(&this->field_0xd4 + (long)pp_Var17[-3]);
    if (0 < iVar33) {
      iVar28 = iVar28 - iVar33;
      iVar18 = 0;
      iVar23 = 0;
      iVar27 = 0;
      do {
        if (0 < iVar33) {
          lVar31 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar27 + lVar31] = iVar23 + (int)lVar31;
            iVar33 = *(int *)(&this->field_0xd4 + (long)pp_Var17[-3]);
            lVar31 = lVar31 + 1;
            iVar30 = (int)lVar31;
          } while (iVar30 < iVar33);
          iVar27 = iVar27 + iVar30;
          iVar23 = iVar23 + iVar30;
        }
        iVar23 = iVar23 + iVar28;
        iVar18 = iVar18 + 1;
      } while (iVar18 < iVar33);
    }
    if (0 < (int)uVar32) {
      local_1d8 = (ulong)local_178;
      local_120 = bottom_top_blob->data;
      local_128 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      local_130 = (Allocator *)local_228.data;
      local_138 = local_228.cstep *
                  CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize);
      local_d8._0_8_ =
           (long)local_228.w * CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize);
      local_158 = 1.0 / (float)(int)uVar34;
      auVar13._24_8_ = 0;
      auVar13._0_24_ = local_f8._8_24_;
      local_f8 = auVar13 << 0x40;
      local_b8 = 0x80000000;
      uStack_b4 = 0x80000000;
      uStack_b0 = 0x80000000;
      uStack_ac = 0x80000000;
      do {
        if (0 < (int)local_118._0_4_) {
          local_1e0 = (Mat *)((long)&local_130->_vptr_Allocator + local_138 * local_f8._0_8_);
          pvVar26 = (void *)(local_128 * local_f8._0_8_ + (long)local_120);
          pp_Var17 = this->_vptr_LRN_x86_avx2;
          local_230 = 0;
          do {
            pMVar14 = local_1e0;
            if (0 < local_178) {
              lVar31 = local_d8._0_8_ * local_230;
              lVar36 = 0;
              do {
                if (local_98 == 0.0) {
                  fVar37 = 0.0;
                }
                else {
                  fVar37 = 0.0;
                  uVar22 = 0;
                  do {
                    fVar37 = fVar37 + *(float *)((long)&pMVar14->data +
                                                (long)piVar15[uVar22] * 4 + lVar36 * 4 + lVar31);
                    uVar22 = uVar22 + 1;
                  } while (uVar34 + (uVar34 == 0) != uVar22);
                }
                auVar9 = vfmadd213ss_fma(ZEXT416((uint)(fVar37 * (float)local_148._0_4_)),
                                         ZEXT416((uint)local_158),
                                         ZEXT416(*(uint *)(&this->field_0xe0 + (long)pp_Var17[-3])))
                ;
                fVar37 = powf(auVar9._0_4_,
                              (float)(*(uint *)(&this->field_0xdc + (long)pp_Var17[-3]) ^ local_b8))
                ;
                *(float *)((long)pvVar26 + lVar36 * 4) =
                     fVar37 * *(float *)((long)pvVar26 + lVar36 * 4);
                lVar36 = lVar36 + 1;
              } while (lVar36 != CONCAT44(iStack_174,local_178));
            }
            pvVar26 = (void *)((long)pvVar26 + local_1d8 * 4);
            local_230 = local_230 + 1;
          } while (local_230 != local_118._0_8_);
        }
        uVar22 = local_f8._0_8_ + 1;
        local_f8._0_8_ = uVar22;
      } while (uVar22 != local_1d0);
    }
    if (piVar15 != (pointer)0x0) {
      operator_delete(piVar15,(long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_end_of_storage - (long)piVar15);
    }
    piVar10 = (int *)CONCAT44(local_228.refcount._4_4_,(int)local_228.refcount);
    iVar28 = 0;
    if (piVar10 == (int *)0x0) goto LAB_001ef63b;
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 != 0) goto LAB_001ef63b;
    if (local_228.allocator != (Allocator *)0x0) {
      (*(local_228.allocator)->_vptr_Allocator[3])();
      goto LAB_001ef63b;
    }
  }
  iVar28 = 0;
  if ((Allocator *)local_228.data != (Allocator *)0x0) {
    iVar28 = 0;
    free(local_228.data);
  }
LAB_001ef63b:
  piVar10 = (int *)CONCAT44(local_1c8.refcount._4_4_,(int)local_1c8.refcount);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_1c8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_1c8.data != (Allocator *)0x0) {
          free(local_1c8.data);
        }
      }
      else {
        (*(local_1c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar28;
}

Assistant:

int LRN_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * pow(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}